

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O2

void __thiscall
t_markdown_generator::print_const_value
          (t_markdown_generator *this,t_type *type,t_const_value *tvalue)

{
  ofstream_with_content_based_conditional_update *poVar1;
  undefined4 uVar2;
  _func_int **pp_Var3;
  __type _Var4;
  bool bVar5;
  t_const_value_type tVar6;
  int iVar7;
  ostream *poVar8;
  undefined4 extraout_var;
  _Base_ptr p_Var9;
  int64_t iVar10;
  undefined8 uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  undefined4 extraout_var_00;
  t_type *type_00;
  t_type *ptVar12;
  t_markdown_generator *this_00;
  char *pcVar13;
  string *this_01;
  _Alloc_hider _Var14;
  string fname;
  string name;
  string local_138;
  _Rb_tree_node_base *local_118;
  string local_110;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  tVar6 = t_const_value::get_type(tvalue);
  if (tVar6 == CV_IDENTIFIER) {
    std::__cxx11::string::string
              ((string *)&local_50,(string *)&((this->super_t_generator).program_)->name_);
    make_file_name(&fname,this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_138,(string *)&tvalue->identifierVal_);
    escape_html(&name,this,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    poVar8 = std::operator<<((ostream *)&this->f_out_,"[```");
    poVar8 = std::operator<<(poVar8,(string *)&name);
    std::__cxx11::string::string((string *)&local_f0,(string *)&fname);
    make_file_link(&local_d0,this,&local_f0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   "```](",&local_d0);
    this_00 = (t_markdown_generator *)local_b0;
    std::operator+(&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   "#constant-");
    str_to_id(&local_110,this_00,&name);
    std::operator+(&local_70,&local_90,&local_110);
    std::operator+(&local_138,&local_70,")");
    std::operator<<(poVar8,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    this_01 = &name;
LAB_001f2961:
    std::__cxx11::string::~string((string *)this_01);
    std::__cxx11::string::~string((string *)&fname);
    return;
  }
  while (iVar7 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[9])(type),
        (char)iVar7 != '\0') {
    type = t_typedef::get_type((t_typedef *)type);
  }
  iVar7 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[5])(type);
  if ((char)iVar7 == '\0') {
    iVar7 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[10])(type);
    if ((char)iVar7 != '\0') {
      iVar7 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[3])(type);
      escape_html(&fname,this,(string *)CONCAT44(extraout_var,iVar7));
      poVar8 = std::operator<<((ostream *)&this->f_out_,(string *)&fname);
      poVar8 = std::operator<<(poVar8,".");
      t_const_value::get_identifier_name_abi_cxx11_(&local_138,tvalue);
      escape_html(&name,this,&local_138);
      std::operator<<(poVar8,(string *)&name);
      std::__cxx11::string::~string((string *)&name);
      this_01 = &local_138;
      goto LAB_001f2961;
    }
    iVar7 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xb])(type);
    if (((char)iVar7 == '\0') &&
       (iVar7 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xc])(type),
       (char)iVar7 == '\0')) {
      iVar7 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0x10])(type);
      if ((char)iVar7 != '\0') {
        poVar1 = &this->f_out_;
        std::operator<<((ostream *)poVar1,"{ ");
        std::
        _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
        ::_Rb_tree((_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                    *)&fname,
                   (_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                    *)tvalue);
        bVar5 = true;
        uVar11 = fname.field_2._8_8_;
        while ((size_type *)uVar11 != &fname._M_string_length) {
          if (!bVar5) {
            std::operator<<((ostream *)poVar1,", ");
          }
          print_const_value(this,*(t_type **)&((t_typedef *)type)->forward_,
                            *(t_const_value **)(uVar11 + 0x20));
          std::operator<<((ostream *)poVar1," = ");
          print_const_value(this,(t_type *)
                                 (((t_typedef *)((long)type + 0xb8))->super_t_type).super_t_doc.
                                 _vptr_t_doc,
                            (t_const_value *)((_Rb_tree_node_base *)(uVar11 + 0x20))->_M_parent);
          uVar11 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar11);
          bVar5 = false;
        }
        std::operator<<((ostream *)poVar1," }");
        std::
        _Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
        ::~_Rb_tree((_Rb_tree<t_const_value_*,_std::pair<t_const_value_*const,_t_const_value_*>,_std::_Select1st<std::pair<t_const_value_*const,_t_const_value_*>_>,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                     *)&fname);
        return;
      }
      iVar7 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xe])(type);
      if ((char)iVar7 == '\0') {
        iVar7 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[0xf])(type);
        poVar1 = &this->f_out_;
        if ((char)iVar7 == '\0') {
          std::operator<<((ostream *)poVar1,"UNKNOWN TYPE");
          return;
        }
        std::operator<<((ostream *)poVar1,"{ ");
        std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::vector
                  ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)&fname,
                   &tvalue->listVal_);
        bVar5 = true;
        for (_Var14 = fname._M_dataplus; _Var14._M_p != (pointer)fname._M_string_length;
            _Var14._M_p = _Var14._M_p + 8) {
          if (!bVar5) {
            std::operator<<((ostream *)poVar1,", ");
          }
          print_const_value(this,*(t_type **)&((t_typedef *)type)->forward_,
                            *(t_const_value **)_Var14._M_p);
          bVar5 = false;
        }
        std::operator<<((ostream *)poVar1," }");
      }
      else {
        poVar1 = &this->f_out_;
        std::operator<<((ostream *)poVar1,"{ ");
        std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::vector
                  ((vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)&fname,
                   &tvalue->listVal_);
        bVar5 = true;
        for (_Var14 = fname._M_dataplus; _Var14._M_p != (pointer)fname._M_string_length;
            _Var14._M_p = _Var14._M_p + 8) {
          if (!bVar5) {
            std::operator<<((ostream *)poVar1,", ");
          }
          print_const_value(this,*(t_type **)&((t_typedef *)type)->forward_,
                            *(t_const_value **)_Var14._M_p);
          bVar5 = false;
        }
        std::operator<<((ostream *)poVar1," }");
      }
      std::_Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>::~_Vector_base
                ((_Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_> *)&fname);
      return;
    }
    poVar1 = &this->f_out_;
    std::operator<<((ostream *)poVar1,"{ ");
    p_Var9 = (tvalue->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_118 = &(tvalue->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header;
    bVar5 = true;
    while (p_Var9 != local_118) {
      type_00 = (t_type *)0x0;
      for (ptVar12 = ((t_typedef *)type)->type_;
          ptVar12 != (t_type *)(((t_typedef *)type)->symbolic_)._M_dataplus._M_p;
          ptVar12 = (t_type *)&(ptVar12->super_t_doc).doc_) {
        pp_Var3 = (ptVar12->super_t_doc)._vptr_t_doc;
        std::__cxx11::string::string((string *)&fname,(string *)(*(long *)(p_Var9 + 1) + 0x48));
        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(pp_Var3 + 0xd),&fname);
        std::__cxx11::string::~string((string *)&fname);
        if (_Var4) {
          type_00 = (t_type *)(ptVar12->super_t_doc)._vptr_t_doc[0xc];
        }
      }
      if (type_00 == (t_type *)0x0) {
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
        iVar7 = (*(((t_typedef *)type)->super_t_type).super_t_doc._vptr_t_doc[3])(type);
        std::operator+(&name,"type error: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var_00,iVar7));
        std::operator+(&fname,&name," has no field ");
        std::__cxx11::string::string((string *)&local_138,(string *)(*(long *)(p_Var9 + 1) + 0x48));
        std::operator+(__return_storage_ptr__,&fname,&local_138);
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
      if (!bVar5) {
        std::operator<<((ostream *)poVar1,", ");
      }
      std::__cxx11::string::string((string *)&name,(string *)(*(long *)(p_Var9 + 1) + 0x48));
      escape_html(&fname,this,&name);
      poVar8 = std::operator<<((ostream *)poVar1,(string *)&fname);
      std::operator<<(poVar8," = ");
      std::__cxx11::string::~string((string *)&fname);
      std::__cxx11::string::~string((string *)&name);
      print_const_value(this,type_00,(t_const_value *)p_Var9[1]._M_parent);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      bVar5 = false;
    }
    pcVar13 = " }";
    goto LAB_001f2c2f;
  }
  uVar2 = *(undefined4 *)&((t_typedef *)type)->type_;
  poVar1 = &this->f_out_;
  std::operator<<((ostream *)poVar1,"```");
  switch(uVar2) {
  case 1:
    t_generator::get_escaped_string_abi_cxx11_(&name,&this->super_t_generator,tvalue);
    escape_html(&fname,this,&name);
    std::operator<<((ostream *)poVar1,(string *)&fname);
    std::__cxx11::string::~string((string *)&fname);
    std::__cxx11::string::~string((string *)&name);
    break;
  case 2:
    iVar10 = t_const_value::get_integer(tvalue);
    pcVar13 = "true";
    if (iVar10 == 0) {
      pcVar13 = "false";
    }
    goto LAB_001f2b4a;
  case 3:
  case 4:
  case 5:
  case 6:
switchD_001f28bb_caseD_3:
    t_const_value::get_integer(tvalue);
    std::ostream::_M_insert<long>((long)poVar1);
    break;
  case 7:
    tVar6 = t_const_value::get_type(tvalue);
    if (tVar6 == CV_INTEGER) goto switchD_001f28bb_caseD_3;
    std::ostream::_M_insert<double>(tvalue->doubleVal_);
    break;
  default:
    pcVar13 = "UNKNOWN BASE TYPE";
LAB_001f2b4a:
    std::operator<<((ostream *)poVar1,pcVar13);
  }
  pcVar13 = "```";
LAB_001f2c2f:
  std::operator<<((ostream *)&this->f_out_,pcVar13);
  return;
}

Assistant:

void t_markdown_generator::print_const_value(t_type* type, t_const_value* tvalue) {

  // if tvalue is an identifier, the constant content is already shown elsewhere
  if (tvalue->get_type() == t_const_value::CV_IDENTIFIER) {
    string fname = make_file_name(program_->get_name());
    string name = escape_html(tvalue->get_identifier());
    f_out_ << "[```" << name << "```](" 
      + make_file_link(fname) 
      + "#constant-" + str_to_id(name) + ")";
    return;
  }

  t_type* truetype = type;
  while (truetype->is_typedef()) {
    truetype = ((t_typedef*)truetype)->get_type();
  }

  bool first = true;
  if (truetype->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)truetype)->get_base();
    f_out_ << "```";
    switch (tbase) {
    case t_base_type::TYPE_STRING: 
      f_out_ << escape_html(get_escaped_string(tvalue));
      break;
    case t_base_type::TYPE_BOOL:
      f_out_ << ((tvalue->get_integer() != 0) ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
      f_out_ << tvalue->get_integer();
      break;
    case t_base_type::TYPE_I16:
      f_out_ << tvalue->get_integer();
      break;
    case t_base_type::TYPE_I32:
      f_out_ << tvalue->get_integer();
      break;
    case t_base_type::TYPE_I64:
      f_out_ << tvalue->get_integer();
      break;
    case t_base_type::TYPE_DOUBLE:
      if (tvalue->get_type() == t_const_value::CV_INTEGER) {
        f_out_ << tvalue->get_integer();
      } else {
        f_out_ << tvalue->get_double();
      }
      break;
    default:
      f_out_ << "UNKNOWN BASE TYPE";
      break;
    }
    f_out_ << "```";
  } else if (truetype->is_enum()) {
    f_out_ << escape_html(truetype->get_name()) << "."
           << escape_html(tvalue->get_identifier_name());
  } else if (truetype->is_struct() || truetype->is_xception()) {
    f_out_ << "{ ";
    const vector<t_field*>& fields = ((t_struct*)truetype)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = tvalue->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + truetype->get_name() + " has no field "
            + v_iter->first->get_string();
      }
      if (!first) {
        f_out_ << ", ";
      }
      first = false;
      f_out_ << escape_html(v_iter->first->get_string()) << " = ";
      print_const_value(field_type, v_iter->second);
    }
    f_out_ << " }";
  } else if (truetype->is_map()) {
    f_out_ << "{ ";
    map<t_const_value*, t_const_value*, t_const_value::value_compare> map_elems = tvalue->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::iterator map_iter;
    for (map_iter = map_elems.begin(); map_iter != map_elems.end(); map_iter++) {
      if (!first) {
        f_out_ << ", ";
      }
      first = false;
      print_const_value(((t_map*)truetype)->get_key_type(), map_iter->first);
      f_out_ << " = ";
      print_const_value(((t_map*)truetype)->get_val_type(), map_iter->second);
    }
    f_out_ << " }";
  } else if (truetype->is_list()) {
    f_out_ << "{ ";
    vector<t_const_value*> list_elems = tvalue->get_list();
    ;
    vector<t_const_value*>::iterator list_iter;
    for (list_iter = list_elems.begin(); list_iter != list_elems.end(); list_iter++) {
      if (!first) {
        f_out_ << ", ";
      }
      first = false;
      print_const_value(((t_list*)truetype)->get_elem_type(), *list_iter);
    }
    f_out_ << " }";
  } else if (truetype->is_set()) {
    f_out_ << "{ ";
    vector<t_const_value*> list_elems = tvalue->get_list();
    ;
    vector<t_const_value*>::iterator list_iter;
    for (list_iter = list_elems.begin(); list_iter != list_elems.end(); list_iter++) {
      if (!first) {
        f_out_ << ", ";
      }
      first = false;
      print_const_value(((t_set*)truetype)->get_elem_type(), *list_iter);
    }
    f_out_ << " }";
  } else {
    f_out_ << "UNKNOWN TYPE";
  }
}